

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printKTXInfo2(ktxStream *stream,KTX_header *pHeader)

{
  ktx_uint32_t kVar1;
  uint uVar2;
  bool bVar3;
  ktx_error_code_e kVar4;
  ktx_uint8_t *pKvd;
  uint32_t level;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t sStack_50;
  ktx_uint32_t faceLodSize;
  KTX_header *local_40;
  KTX_supplemental_info suppInfo;
  
  if (pHeader->endianness == 0x1020304) {
    pcVar6 = 
    "This file has opposite endianness to this machine. Following\nare the converted pHeader values\n\n"
    ;
    sStack_50 = 0x5f;
  }
  else {
    pcVar6 = "Header\n\n";
    sStack_50 = 8;
  }
  fwrite(pcVar6,sStack_50,1,_stdout);
  printKTXHeader(pHeader);
  kVar4 = ktxCheckHeader1_(pHeader,&suppInfo);
  if (kVar4 == KTX_SUCCESS) {
    local_40 = pHeader;
    if (pHeader->bytesOfKeyValueData == 0) {
      fwrite("\nNo Key/Value data.\n",0x14,1,_stdout);
    }
    else {
      fwrite("\nKey/Value Data\n\n",0x11,1,_stdout);
      uVar5 = local_40->bytesOfKeyValueData;
      pKvd = (ktx_uint8_t *)malloc((ulong)uVar5);
      pHeader = local_40;
      (*stream->read)(stream,pKvd,(ulong)uVar5);
      printKVData(pKvd,pHeader->bytesOfKeyValueData);
      free(pKvd);
    }
    kVar1 = pHeader->numberOfMipLevels;
    if ((pHeader->numberOfArrayElements != 0) || (bVar3 = true, pHeader->numberOfFaces != 6)) {
      bVar3 = false;
    }
    fwrite("\nData Sizes (bytes)\n------------------\n",0x27,1,_stdout);
    lVar7 = 0;
    for (uVar5 = 0; kVar1 + (kVar1 == 0) != uVar5; uVar5 = uVar5 + 1) {
      (*stream->read)(stream,&faceLodSize,4);
      if (pHeader->endianness == 0x1020304) {
        _ktxSwapEndian32(&faceLodSize,1);
      }
      uVar2 = faceLodSize * 6;
      if (!bVar3) {
        uVar2 = faceLodSize;
      }
      uVar8 = (ulong)uVar2;
      (*stream->skip)(stream,uVar8);
      lVar7 = lVar7 + uVar8;
      fprintf(_stdout,"Level %u: %u\n",(ulong)uVar5,uVar8);
      pHeader = local_40;
    }
    fprintf(_stdout,"\nTotal: %ld\n",lVar7);
  }
  else {
    fwrite("The KTX 1 file pHeader is invalid:\n",0x23,1,_stdout);
    if (kVar4 == KTX_UNSUPPORTED_FEATURE) {
      pcVar6 = "  it describes an unsupported feature or format\n";
      sStack_50 = 0x30;
    }
    else {
      if (kVar4 != KTX_FILE_DATA_ERROR) {
        return;
      }
      pcVar6 = 
      "  it has invalid data such as bad glTypeSize, improper dimensions,\nimproper number of faces or too many levels.\n"
      ;
      sStack_50 = 0x70;
    }
    fwrite(pcVar6,sStack_50,1,_stdout);
  }
  return;
}

Assistant:

void
printKTXInfo2(ktxStream* stream, KTX_header* pHeader)
{
    ktx_uint8_t* metadata;
    KTX_supplemental_info suppInfo;
    KTX_error_code result;

    if (pHeader->endianness == KTX_ENDIAN_REF_REV) {
        fprintf(stdout, "This file has opposite endianness to this machine. Following\n"
                        "are the converted pHeader values\n\n");
    } else {
        fprintf(stdout, "Header\n\n");
    }
    // Print first as ktxCheckHeader1_ modifies the header.
    printKTXHeader(pHeader);

    result = ktxCheckHeader1_(pHeader, &suppInfo);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "The KTX 1 file pHeader is invalid:\n");
        switch (result) {
          case KTX_FILE_DATA_ERROR:
            fprintf(stdout, "  it has invalid data such as bad glTypeSize, improper dimensions,\n"
                            "improper number of faces or too many levels.\n");
            break;
          case KTX_UNSUPPORTED_FEATURE:
            fprintf(stdout, "  it describes an unsupported feature or format\n");
            break;
          default:
              ; // _ktxCheckHeader returns only the above 2 errors.
        }
        return;
    }

    if (pHeader->bytesOfKeyValueData) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        metadata = malloc(pHeader->bytesOfKeyValueData);
        stream->read(stream, metadata, pHeader->bytesOfKeyValueData);
        printKVData(metadata, pHeader->bytesOfKeyValueData);
        free(metadata);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    uint32_t levelCount = MAX(1, pHeader->numberOfMipLevels);
    bool nonArrayCubemap;
    if (pHeader->numberOfArrayElements == 0 && pHeader->numberOfFaces == 6)
        nonArrayCubemap = true;
    else
        nonArrayCubemap = false;
    ktx_uint64_t dataSize = 0;
    // A note about padding: Since KTX requires a row alignment of 4 for
    // uncompressed and all block-compressed formats have block sizes that
    // are a multiple of 4, all levels and faces will also be a multiple
    // of 4 so mipPadding and facePadding will always be 0. So they are
    // ignored here.
    fprintf(stdout, "\nData Sizes (bytes)\n------------------\n");
    for (uint32_t level = 0; level < levelCount; level++) {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t lodSize;
        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (pHeader->endianness == KTX_ENDIAN_REF_REV)
            _ktxSwapEndian32(&faceLodSize, 1);
        if (nonArrayCubemap) {
            lodSize = faceLodSize * 6;
        } else {
            lodSize = faceLodSize;
        }
        result = stream->skip(stream, lodSize);
        dataSize += lodSize;
        fprintf(stdout, "Level %u: %u\n", level, lodSize);
    }
    fprintf(stdout, "\nTotal: %" PRId64 "\n", dataSize);
}